

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstr.hpp
# Opt level: O2

void __thiscall zstr::ifstream::ifstream(ifstream *this)

{
  undefined1 *this_00;
  istreambuf *this_01;
  
  std::ios::ios((ios *)&this->field_0x218);
  this_00 = &(this->super_istream).field_0x10;
  memset(this_00,0,0x208);
  detail::strict_fstream_holder<strict_fstream::ifstream>::strict_fstream_holder
            ((strict_fstream_holder<strict_fstream::ifstream> *)this_00);
  (this->super_istream)._vptr_basic_istream = (_func_int **)0x432360;
  *(undefined8 *)&this->field_0x218 = 0x432388;
  this_01 = (istreambuf *)operator_new(0x80);
  istreambuf::istreambuf(this_01,(streambuf *)&(this->super_istream).field_0x20,0x100000,true,0);
  std::istream::istream(this,(streambuf *)&PTR_construction_vtable_24__004323a0);
  (this->super_istream)._vptr_basic_istream = (_func_int **)0x432360;
  *(undefined8 *)&this->field_0x218 = 0x432388;
  return;
}

Assistant:

explicit ifstream()
      : detail::strict_fstream_holder<strict_fstream::ifstream>(),
        std::istream(new istreambuf(_fs.rdbuf())) {}